

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builtin_policy.cpp
# Opt level: O1

ValuedAction __thiscall despot::RandomPolicy::Search(RandomPolicy *this)

{
  ACT_TYPE _action;
  int n;
  double rand_num;
  ValuedAction VVar1;
  ValuedAction local_18;
  
  if ((this->action_probs_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_finish ==
      (this->action_probs_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start) {
    n = (*((this->super_DefaultPolicy).super_ScenarioLowerBound.model_)->_vptr_DSPOMDP[5])();
    _action = Random::NextInt((Random *)&Random::RANDOM,n);
  }
  else {
    rand_num = Random::NextDouble((Random *)&Random::RANDOM);
    _action = Random::GetCategory(&this->action_probs_,rand_num);
  }
  ValuedAction::ValuedAction(&local_18,_action,-INFINITY);
  VVar1._4_4_ = 0;
  VVar1.action = local_18.action;
  VVar1.value = local_18.value;
  return VVar1;
}

Assistant:

ValuedAction RandomPolicy::Search() {
	double dummy_value = Globals::NEG_INFTY;
	if (action_probs_.size() > 0) {
		return ValuedAction(
			Random::GetCategory(action_probs_, Random::RANDOM.NextDouble()),
			dummy_value);
	} else {
		return ValuedAction(Random::RANDOM.NextInt(model_->NumActions()),
			dummy_value);
	}
}